

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O0

void __thiscall
jsonChildren::insert(jsonChildren *this,JSONNode ***position,JSONNode *item,bool reverse)

{
  uint uVar1;
  JSONNode **ppJVar2;
  JSONNode **__src;
  undefined1 local_58 [8];
  iteratorKeeper<false> ik_1;
  iteratorKeeper<true> ik;
  bool reverse_local;
  JSONNode *item_local;
  JSONNode ***position_local;
  jsonChildren *this_local;
  
  if (reverse) {
    iteratorKeeper<true>::iteratorKeeper((iteratorKeeper<true> *)&ik_1.myPos,this,position);
    inc(this);
    iteratorKeeper<true>::~iteratorKeeper((iteratorKeeper<true> *)&ik_1.myPos);
  }
  else {
    iteratorKeeper<false>::iteratorKeeper((iteratorKeeper<false> *)local_58,this,position);
    inc(this);
    iteratorKeeper<false>::~iteratorKeeper((iteratorKeeper<false> *)local_58);
  }
  ppJVar2 = *position;
  __src = *position;
  uVar1 = this->mysize;
  this->mysize = uVar1 + 1;
  memmove(ppJVar2 + 1,__src,((ulong)uVar1 - ((long)*position - (long)this->array >> 3)) * 8);
  **position = item;
  return;
}

Assistant:

void insert(JSONNode ** & position, JSONNode * item, bool reverse = false) json_nothrow {
    #endif
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null insert"));
	   //position isnt relative to array because of realloc
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array insert 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("position is above the end of the array insert 1"));
		#ifndef JSON_LIBRARY
		if (reverse){
			iteratorKeeper<true> ik(this, position);
			inc();
		} else 
		#endif
		{
			iteratorKeeper<false> ik(this, position);
			inc();
		}

	   std::memmove(position + 1, position, (mysize++ - (position - array)) * sizeof(JSONNode *));
	   *position = item;
    }